

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.h
# Opt level: O2

void __thiscall soplex::SPxWeightST<double>::SPxWeightST(SPxWeightST<double> *this)

{
  (this->super_SPxStarter<double>).m_name = "Weight";
  (this->super_SPxStarter<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_SPxStarter<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_SPxStarter<double>)._vptr_SPxStarter = (_func_int **)&PTR__SPxWeightST_0053f678;
  DataArray<int>::DataArray(&this->forbidden,0,0,1.2);
  Array<double>::Array(&this->rowWeight,0);
  Array<double>::Array(&this->colWeight,0);
  DataArray<bool>::DataArray(&this->rowRight,0,0,1.2);
  DataArray<bool>::DataArray(&this->colUp,0,0,1.2);
  this->weight = (Array<double> *)0x0;
  this->coWeight = (Array<double> *)0x0;
  return;
}

Assistant:

SPxWeightST()
      : SPxStarter<R>("Weight")
   {
      weight = nullptr;
      coWeight = nullptr;
      assert(isConsistent());
   }